

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_ctcp *ctcp;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if ((in_ESI == 0xfffffffe) && (in_EDX == 0xfffffffd)) {
    iVar1 = nn_stcp_isidle((nn_stcp *)0x16cc8c);
    if (iVar1 == 0) {
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
      nn_stcp_stop((nn_stcp *)0x16ccba);
    }
    *(undefined4 *)(local_28 + 0x58) = 10;
  }
  if (*(int *)(local_28 + 0x58) == 10) {
    iVar1 = nn_stcp_isidle((nn_stcp *)0x16cce2);
    if (iVar1 == 0) {
      return;
    }
    nn_backoff_stop((nn_backoff *)0x16ccfd);
    nn_usock_stop((nn_usock *)0x16cd0b);
    nn_dns_stop((nn_dns *)0x16cd1c);
    *(undefined4 *)(local_28 + 0x58) = 0xb;
  }
  if (*(int *)(local_28 + 0x58) == 0xb) {
    iVar1 = nn_backoff_isidle((nn_backoff *)0x16cd52);
    if (((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)0x16cd65), iVar1 != 0)) &&
       (iVar1 = nn_dns_isidle((nn_dns *)0x16cd7b), iVar1 != 0)) {
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped_noevent((nn_fsm *)0x16cd9b);
      nn_ep_stopped((nn_ep *)0x16cda9);
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
          ,0x102);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_ctcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ctcp *ctcp;

    ctcp = nn_cont (self, struct nn_ctcp, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {
        if (!nn_stcp_isidle (&ctcp->stcp)) {
            nn_ep_stat_increment (ctcp->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_stcp_stop (&ctcp->stcp);
        }
        ctcp->state = NN_CTCP_STATE_STOPPING_STCP_FINAL;
    }
    if (ctcp->state == NN_CTCP_STATE_STOPPING_STCP_FINAL) {
        if (!nn_stcp_isidle (&ctcp->stcp))
            return;
        nn_backoff_stop (&ctcp->retry);
        nn_usock_stop (&ctcp->usock);
        nn_dns_stop (&ctcp->dns);
        ctcp->state = NN_CTCP_STATE_STOPPING;
    }
    if (nn_slow (ctcp->state == NN_CTCP_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&ctcp->retry) ||
              !nn_usock_isidle (&ctcp->usock) ||
              !nn_dns_isidle (&ctcp->dns))
            return;
        ctcp->state = NN_CTCP_STATE_IDLE;
        nn_fsm_stopped_noevent (&ctcp->fsm);
        nn_ep_stopped (ctcp->ep);
        return;
    }

    nn_fsm_bad_state (ctcp->state, src, type);
}